

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

string * testing::internal::ExitSummary_abi_cxx11_(int exit_code)

{
  byte in_SIL;
  string *in_RDI;
  Message m;
  char (*in_stack_ffffffffffffffa8) [25];
  Message *in_stack_ffffffffffffffb0;
  Message *in_stack_ffffffffffffffb8;
  Message *in_stack_ffffffffffffffe0;
  
  Message::Message(in_stack_ffffffffffffffe0);
  if ((in_SIL & 0x7f) == 0) {
    in_stack_ffffffffffffffb8 =
         Message::operator<<(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    Message::operator<<(in_stack_ffffffffffffffb0,(int *)in_stack_ffffffffffffffa8);
  }
  else if ('\0' < (char)((in_SIL & 0x7f) + 1) >> 1) {
    in_stack_ffffffffffffffb0 =
         Message::operator<<(in_stack_ffffffffffffffb0,(char (*) [22])in_stack_ffffffffffffffa8);
    Message::operator<<(in_stack_ffffffffffffffb0,(int *)in_stack_ffffffffffffffa8);
  }
  if ((in_SIL & 0x80) != 0) {
    Message::operator<<(in_stack_ffffffffffffffb0,(char (*) [15])in_stack_ffffffffffffffa8);
  }
  Message::GetString_abi_cxx11_(in_stack_ffffffffffffffb8);
  Message::~Message((Message *)0x1811bb);
  return in_RDI;
}

Assistant:

static std::string ExitSummary(int exit_code) {
  Message m;

#if defined(GTEST_OS_WINDOWS) || defined(GTEST_OS_FUCHSIA)

  m << "Exited with exit status " << exit_code;

#else

  if (WIFEXITED(exit_code)) {
    m << "Exited with exit status " << WEXITSTATUS(exit_code);
  } else if (WIFSIGNALED(exit_code)) {
    m << "Terminated by signal " << WTERMSIG(exit_code);
  }
#ifdef WCOREDUMP
  if (WCOREDUMP(exit_code)) {
    m << " (core dumped)";
  }
#endif
#endif  // GTEST_OS_WINDOWS || GTEST_OS_FUCHSIA

  return m.GetString();
}